

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationContainer.cpp
# Opt level: O2

void __thiscall UtilizationContainer::updateLegend(UtilizationContainer *this)

{
  int iVar1;
  QLabel *pQVar2;
  QArrayDataPointer<char16_t> QStack_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  QString::QString((QString *)&local_28,"graphStep");
  pQVar2 = QObject::findChild<QLabel*>((QObject *)this,(QString *)&local_28,(FindChildOptions)0x1);
  iVar1 = SettingsManager::getUpdateDelay();
  QString::number((double)((float)iVar1 / 1000.0),(char)&QStack_58,0x67);
  operator+((QString *)&local_40,(QString *)&QStack_58," sec step");
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QString::QString((QString *)&local_28,"graphTime");
  pQVar2 = QObject::findChild<QLabel*>((QObject *)this,(QString *)&local_28,(FindChildOptions)0x1);
  iVar1 = SettingsManager::getGraphLength();
  QString::number((double)((float)iVar1 / 1000.0),(char)&QStack_58,0x67);
  operator+((QString *)&local_40,(QString *)&QStack_58," sec");
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  onLegendUpdate(this);
  return;
}

Assistant:

void UtilizationContainer::updateLegend() {
    findChild<QLabel*>(graphStepName)->setText(QString::number(SettingsManager::getUpdateDelay() / 1000.0f) + " sec step");
    findChild<QLabel*>(graphTimeName)->setText(QString::number(SettingsManager::getGraphLength() / 1000.0f) + " sec");
    emit onLegendUpdate();
}